

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathWrapCString(char *val)

{
  xmlXPathObjectPtr pxVar1;
  
  pxVar1 = xmlXPathWrapString((xmlChar *)val);
  return pxVar1;
}

Assistant:

xmlXPathObjectPtr
xmlXPathWrapCString (char * val) {
    return(xmlXPathWrapString((xmlChar *)(val)));
}